

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-outputs.cc
# Opt level: O0

void runtest_maybe_dobin<std::vector<unsigned_int,std::allocator<unsigned_int>>,true>
               (string *header,vector<unsigned_int,_std::allocator<unsigned_int>_> *arg)

{
  char *pcVar1;
  ostream *poVar2;
  void *this;
  string local_2c8;
  string local_2a8 [48];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_278;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_258;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_238;
  undefined1 local_218 [8];
  ofstream log_fh;
  vector<unsigned_int,_std::allocator<unsigned_int>_> *arg_local;
  string *header_local;
  
  std::operator+(&local_278,&basedir_abi_cxx11_,"/");
  std::operator+(&local_258,&local_278,header);
  std::operator+(&local_238,&local_258,"-log.txt");
  pcVar1 = (char *)std::__cxx11::string::c_str();
  std::ofstream::ofstream(local_218,pcVar1,_S_out);
  std::__cxx11::string::~string((string *)&local_238);
  std::__cxx11::string::~string((string *)&local_258);
  std::__cxx11::string::~string((string *)&local_278);
  poVar2 = std::operator<<((ostream *)local_218,"--- ");
  poVar2 = std::operator<<(poVar2,(string *)header);
  poVar2 = std::operator<<(poVar2," -------------------------------------");
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_218,"depth=");
  this = (void *)std::ostream::operator<<(poVar2,1);
  std::ostream::operator<<(this,std::endl<char,std::char_traits<char>>);
  poVar2 = std::operator<<((ostream *)local_218,"ModeAutoDecoder=");
  gnuplotio::Mode1D::class_name_abi_cxx11_();
  poVar2 = std::operator<<(poVar2,local_2a8);
  std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
  std::__cxx11::string::~string(local_2a8);
  std::__cxx11::string::string((string *)&local_2c8,(string *)header);
  runtest_inner<std::vector<unsigned_int,std::allocator<unsigned_int>>,true>
            ((ostream *)local_218,&local_2c8,arg);
  std::__cxx11::string::~string((string *)&local_2c8);
  std::ofstream::~ofstream(local_218);
  return;
}

Assistant:

void runtest_maybe_dobin(std::string header, const T &arg) {
    std::ofstream log_fh((basedir+"/"+header+"-log.txt").c_str());
    log_fh << "--- " << header << " -------------------------------------" << std::endl;
    log_fh << "depth=" << ArrayTraits<T>::depth << std::endl;
    log_fh << "ModeAutoDecoder=" << ModeAutoDecoder<T>::mode::class_name() << std::endl;
    runtest_inner<T, DoBinary>(log_fh, header, arg);
}